

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::GetFastClearHeight(GmmResourceInfoCommon *this,uint32_t MipLevel)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  GMM_TEXTURE_CALC *pGVar4;
  undefined4 extraout_var_00;
  SKU_FEATURE_TABLE *pSVar5;
  GMM_TEXTURE_CALC *pTextureCalc;
  uint32_t numSamples;
  uint32_t mipHeight;
  uint32_t height;
  uint32_t MipLevel_local;
  GmmResourceInfoCommon *this_local;
  
  uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x17])(this,(ulong)MipLevel);
  iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x40])();
  iVar3 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  pGVar4 = GmmGetTextureCalc((GMM_LIB_CONTEXT *)CONCAT44(extraout_var,iVar3));
  if (iVar2 == 1) {
    numSamples = (*pGVar4->_vptr_GmmTextureCalc[0x1b])(pGVar4,&this->Surf,(ulong)uVar1);
  }
  else {
    iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pSVar5 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_00,iVar2));
    if (((ulong)pSVar5->field_1 >> 0x22 & 1) == 0) {
      numSamples = (uVar1 + 1) - (uVar1 + 1 & 1) >> 1;
    }
    else {
      numSamples = (uVar1 + 3) - (uVar1 + 3 & 3) >> 2;
    }
  }
  return numSamples;
}

Assistant:

uint32_t GmmLib::GmmResourceInfoCommon::GetFastClearHeight(uint32_t MipLevel)
{
    uint32_t height     = 0;
    uint32_t mipHeight  = GetMipHeight(MipLevel);
    uint32_t numSamples = GetNumSamples();

    GMM_TEXTURE_CALC *pTextureCalc;
    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(&Surf, GetGmmLibContext());

    if(numSamples == 1)
    {
        height = pTextureCalc->ScaleFCRectHeight(&Surf, mipHeight);
    }
    else
    {
        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
        {
            height = GFX_ALIGN(mipHeight, 4) / 4;
        }
        else
        {
            height = GFX_ALIGN(mipHeight, 2) / 2;
        }
    }

    return height;
}